

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::trycatch<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  pointer pAVar3;
  bool bVar4;
  undefined7 in_register_00000009;
  byte bVar5;
  _Alloc_hider _Var6;
  int iVar7;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  undefined1 local_240 [8];
  Result<wasm::Ok> type;
  undefined8 local_208;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  optional<wasm::Name> label;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined1 local_88 [8];
  Result<wasm::Ok> _val_3;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val;
  
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
LAB_00bab70d:
    expected_00._M_str = "try";
    expected_00._M_len = 3;
    bVar4 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar4) {
LAB_00bab776:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
      return __return_storage_ptr__;
    }
  }
  else {
    expected._M_str = "try";
    expected._M_len = 3;
    bVar4 = Lexer::takeSExprStart(&ctx->in,expected);
    if (!bVar4) goto LAB_00bab776;
    if (!folded) goto LAB_00bab70d;
  }
  Lexer::takeID((optional<wasm::Name> *)local_d8,&ctx->in);
  blocktype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_240,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_240);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    local_88 = (undefined1  [8])
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_58,
               (undefined1 *)
               (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_58));
LAB_00bab7ee:
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_88 ==
        (undefined1  [8])
        ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8U)) {
      *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                         _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
LAB_00bab803:
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    }
LAB_00bab813:
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_88 = (undefined1  [8])
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._24_1_ = 0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    if ((folded) &&
       (expected_01._M_str = "do", expected_01._M_len = 2,
       bVar4 = Lexer::takeSExprStart(&ctx->in,expected_01), !bVar4)) {
      type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &stack0xfffffffffffffdf8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                 "expected \'do\' in try","");
      Lexer::err((Err *)local_58,&ctx->in,
                 (string *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      puVar2 = (undefined1 *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
      if (local_58 == (undefined1  [8])puVar2) {
        *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      _Var6._M_p = (pointer)type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      local_58 = (undefined1  [8])puVar2;
      if ((undefined8 *)
          type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &stack0xfffffffffffffdf8)
      goto LAB_00bab839;
      goto LAB_00babea8;
    }
    instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_58,ctx);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_88 = (undefined1  [8])
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_58,
                 (undefined1 *)
                 (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_58));
      goto LAB_00bab7ee;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    if (folded) {
      bVar4 = Lexer::takeRParen(&ctx->in);
      if (!bVar4) {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f8,"expected \')\' at end of do","");
        Lexer::err((Err *)local_58,&ctx->in,&local_1f8);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar2 = (undefined1 *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if (local_58 == (undefined1  [8])puVar2) {
          *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_208 = local_1f8.field_2._M_allocated_capacity;
        _Var6._M_p = local_1f8._M_dataplus._M_p;
        local_58 = (undefined1  [8])puVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_00bab839;
        goto LAB_00babea8;
      }
      if (!folded) goto LAB_00bab89e;
      expected_02._M_str = "delegate";
      expected_02._M_len = 8;
      bVar4 = Lexer::takeSExprStart(&ctx->in,expected_02);
      if (!bVar4) {
        if (!folded) goto LAB_00bab89e;
        goto LAB_00bab992;
      }
    }
    else {
LAB_00bab89e:
      expected_03._M_str = "delegate";
      expected_03._M_len = 8;
      bVar4 = Lexer::takeKeyword(&ctx->in,expected_03);
      if (!bVar4) {
LAB_00bab992:
        _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._39_1_ = !folded;
        local_90 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        do {
          if (folded) {
            expected_04._M_str = "catch";
            expected_04._M_len = 5;
            bVar4 = Lexer::takeSExprStart(&ctx->in,expected_04);
            iVar7 = 3;
            if (bVar4) {
              if (!folded) goto LAB_00bab9df;
              goto LAB_00bab9fd;
            }
          }
          else {
LAB_00bab9df:
            expected_05._M_str = "catch";
            expected_05._M_len = 5;
            bVar4 = Lexer::takeKeyword(&ctx->in,expected_05);
            iVar7 = 3;
            if (bVar4) {
LAB_00bab9fd:
              label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._16_8_ = (ctx->in).pos;
              bVar5 = _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._39_1_;
LAB_00baba0c:
              do {
                if ((!folded) && ((bVar5 & 1) != 0)) {
                  Lexer::takeID((optional<wasm::Name> *)local_58,&ctx->in);
                  bVar4 = true;
                  if ((_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ == '\x01') &&
                     ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01' ||
                      (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ !=
                       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                       str._M_len)))) {
                    (ctx->in).pos =
                         label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._16_8_;
                    pAVar3 = (ctx->in).annotations.
                             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    if ((ctx->in).annotations.
                        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                        ._M_impl.super__Vector_impl_data._M_finish != pAVar3) {
                      (ctx->in).annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_finish = pAVar3;
                    }
                    bVar5 = 0;
                    Lexer::skipSpace(&ctx->in);
                    bVar4 = false;
                  }
                  if (!bVar4) goto LAB_00baba0c;
                }
                tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_58,ctx);
                if (((bVar5 & 1) == 0) ||
                   (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01')) {
                  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::
                  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88,
                                  (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58);
                  if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                    local_b0 = &local_a0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b0,local_88,
                               (undefined1 *)
                               (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                               (long)local_88));
LAB_00babb36:
                    *(undefined8 **)
                     &(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                    if (local_b0 == &local_a0) {
                      *local_90 = CONCAT71(uStack_9f,local_a0);
                      local_90[1] = uStack_98;
                    }
                    else {
                      *(undefined1 **)
                       &(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
                      *(ulong *)((long)&(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                + 0x10) = CONCAT71(uStack_9f,local_a0);
                    }
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                         local_a8;
                    local_a8 = 0;
                    local_a0 = 0;
                    *(__index_type *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                         '\x02';
                    local_b0 = &local_a0;
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                  }
                  else {
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                    instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_88,ctx);
                    if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                      local_b0 = &local_a0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_b0,local_88,
                                 (undefined1 *)
                                 (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                                 (long)local_88));
                      goto LAB_00babb36;
                    }
                    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
                    iVar7 = 5;
                    if ((!folded) || (bVar4 = Lexer::takeRParen(&ctx->in), bVar4))
                    goto LAB_00babba2;
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f8,"expected \')\' at end of catch","");
                    Lexer::err((Err *)local_88,&ctx->in,&local_f8);
                    puVar2 = (undefined1 *)
                             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
                    *(undefined8 **)
                     &(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                    if (local_88 == (undefined1  [8])puVar2) {
                      *local_90 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u.
                                           _9_7_,_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
                                                 _M_u._8_1_);
                      local_90[1] = _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
                    }
                    else {
                      *(undefined1 (*) [8])
                       &(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
                      *(ulong *)((long)&(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                + 0x10) =
                           CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                    }
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                         _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
                    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
                    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
                    *(__index_type *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                         '\x02';
                    local_88 = (undefined1  [8])puVar2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                      operator_delete(local_f8._M_dataplus._M_p,
                                      local_f8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  iVar7 = 1;
                }
                else {
                  (ctx->in).pos =
                       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._16_8_;
                  pAVar3 = (ctx->in).annotations.
                           super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((ctx->in).annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pAVar3) {
                    (ctx->in).annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pAVar3;
                  }
                  Lexer::skipSpace(&ctx->in);
                  iVar7 = 4;
                  bVar5 = 0;
                }
LAB_00babba2:
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
              } while (iVar7 == 4);
              if (iVar7 == 5) {
                iVar7 = 0;
              }
            }
          }
        } while (iVar7 == 0);
        if (iVar7 != 3) goto LAB_00bab839;
        puVar2 = (undefined1 *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if (!folded) {
LAB_00babcdf:
          expected_07._M_str = "catch_all";
          expected_07._M_len = 9;
          bVar4 = Lexer::takeKeyword(&ctx->in,expected_07);
          if (bVar4) {
LAB_00babcfb:
            if (((folded) ||
                (Lexer::takeID((optional<wasm::Name> *)local_88,&ctx->in),
                _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ != '\x01')) ||
               ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ ==
                 label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len)))) {
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
              instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_58,ctx);
              if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                local_88 = (undefined1  [8])puVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_88,local_58,
                           (undefined1 *)
                           (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                           (long)local_58));
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
                if (local_88 != (undefined1  [8])puVar2) {
                  *(undefined1 (*) [8])
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
                  goto LAB_00bab803;
                }
                *local_90 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                     _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                local_90[1] = _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
                goto LAB_00bab813;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
              if (!folded) goto LAB_00babff0;
              bVar4 = Lexer::takeRParen(&ctx->in);
              if (bVar4) goto LAB_00babf76;
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"expected \')\' at end of catch_all","");
              Lexer::err((Err *)local_58,&ctx->in,&local_178);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
              puVar2 = (undefined1 *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              if (local_58 == (undefined1  [8])puVar2) {
                *local_90 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                local_90[1] = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_208 = local_178.field_2._M_allocated_capacity;
              _Var6._M_p = local_178._M_dataplus._M_p;
              local_58 = (undefined1  [8])puVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_00bab839;
            }
            else {
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_198,"catch_all label does not match try label","");
              Lexer::err((Err *)local_58,&ctx->in,&local_198);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
              puVar2 = (undefined1 *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              if (local_58 == (undefined1  [8])puVar2) {
                *local_90 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                local_90[1] = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_208 = local_198.field_2._M_allocated_capacity;
              _Var6._M_p = local_198._M_dataplus._M_p;
              local_58 = (undefined1  [8])puVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_00bab839;
            }
          }
          else {
LAB_00babf76:
            if (folded) goto LAB_00babf7b;
LAB_00babff0:
            expected_08._M_str = "end";
            expected_08._M_len = 3;
            bVar4 = Lexer::takeKeyword(&ctx->in,expected_08);
            if (bVar4) {
              Lexer::takeID((optional<wasm::Name> *)local_88,&ctx->in);
              if ((_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ != '\x01') ||
                 ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                  (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ ==
                   label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len)))) goto LAB_00bac038;
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_118,"end label does not match try label","");
              Lexer::err((Err *)local_58,&ctx->in,&local_118);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
              puVar2 = (undefined1 *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              if (local_58 == (undefined1  [8])puVar2) {
                *local_90 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                local_90[1] = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_208 = local_118.field_2._M_allocated_capacity;
              _Var6._M_p = local_118._M_dataplus._M_p;
              local_58 = (undefined1  [8])puVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_00bab839;
            }
            else {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"expected \'end\' at end of try","");
              Lexer::err((Err *)local_58,&ctx->in,&local_138);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
              puVar2 = (undefined1 *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
              if (local_58 == (undefined1  [8])puVar2) {
                *local_90 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
                local_90[1] = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              local_208 = local_138.field_2._M_allocated_capacity;
              _Var6._M_p = local_138._M_dataplus._M_p;
              local_58 = (undefined1  [8])puVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00bab839;
            }
          }
LAB_00babea8:
          local_58 = (undefined1  [8])
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          operator_delete(_Var6._M_p,local_208 + 1);
          goto LAB_00bab839;
        }
        expected_06._M_str = "catch_all";
        expected_06._M_len = 9;
        bVar4 = Lexer::takeSExprStart(&ctx->in,expected_06);
        if (bVar4) goto LAB_00babcfb;
        if (!folded) goto LAB_00babcdf;
LAB_00babf7b:
        bVar4 = Lexer::takeRParen(&ctx->in);
        if (!bVar4) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"expected \')\' at end of try","");
          Lexer::err((Err *)local_58,&ctx->in,&local_158);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
          puVar2 = (undefined1 *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          if (local_58 == (undefined1  [8])puVar2) {
            *local_90 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
            local_90[1] = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                            _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_208 = local_158.field_2._M_allocated_capacity;
          _Var6._M_p = local_158._M_dataplus._M_p;
          local_58 = (undefined1  [8])puVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_00bab839;
          goto LAB_00babea8;
        }
LAB_00bac038:
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
        goto LAB_00bab834;
      }
    }
    labelidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_58,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58);
    if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_88,
                 (undefined1 *)
                 (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_88));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if (local_b0 == &local_a0) {
        *puVar1 = CONCAT71(uStack_9f,local_a0);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_98;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_b0;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(uStack_9f,local_a0);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_a8;
      local_a8 = 0;
      local_a0 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_b0 = &local_a0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      if (folded) {
        bVar4 = Lexer::takeRParen(&ctx->in);
        if (bVar4) {
          bVar4 = Lexer::takeRParen(&ctx->in);
          if (bVar4) goto LAB_00babe57;
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,"expected \')\' at end of try","");
          Lexer::err((Err *)local_88,&ctx->in,&local_1b8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar2 = (undefined1 *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          if (local_88 == (undefined1  [8])puVar2) {
            *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                            _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_1d8.field_2._M_allocated_capacity = local_1b8.field_2._M_allocated_capacity;
          _Var6._M_p = local_1b8._M_dataplus._M_p;
          local_88 = (undefined1  [8])puVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) goto LAB_00bac2dd;
        }
        else {
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"expected \')\' at end of delegate","");
          Lexer::err((Err *)local_88,&ctx->in,&local_1d8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar2 = (undefined1 *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          if (local_88 == (undefined1  [8])puVar2) {
            *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                            _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          _Var6._M_p = local_1d8._M_dataplus._M_p;
          local_88 = (undefined1  [8])puVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_00bac2dd:
            local_88 = (undefined1  [8])
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
            _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
            _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
            operator_delete(_Var6._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
LAB_00babe57:
        _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
    }
  }
LAB_00bab834:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
LAB_00bab839:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_240);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
trycatch(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try"sv)) ||
      (!folded && !ctx.in.takeKeyword("try"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeTry(pos, annotations, label, *type));

  if (folded) {
    if (!ctx.in.takeSExprStart("do"sv)) {
      return ctx.in.err("expected 'do' in try");
    }
  }

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of do");
    }
  }

  if ((folded && ctx.in.takeSExprStart("delegate")) ||
      (!folded && ctx.in.takeKeyword("delegate"))) {
    auto delegatePos = ctx.in.getPos();

    auto label = labelidx(ctx, true);
    CHECK_ERR(label);

    if (folded) {
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of delegate");
      }
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of try");
      }
    }

    CHECK_ERR(ctx.visitDelegate(delegatePos, *label));
    return Ok{};
  }

  while (true) {
    auto catchPos = ctx.in.getPos();

    if ((folded && !ctx.in.takeSExprStart("catch"sv)) ||
        (!folded && !ctx.in.takeKeyword("catch"sv))) {
      break;
    }

    // It can be ambiguous whether the name after `catch` is intended to be the
    // optional ID or the tag identifier. For example:
    //
    // (tag $t)
    // (func $ambiguous
    //   try $t
    //   catch $t
    //   end
    // )
    //
    // When parsing the `catch`, the parser first tries to parse an optional ID
    // that must match the label of the `try`, and it succeeds because it sees
    // `$t` after the catch. However, when it then tries to parse the mandatory
    // tag index, it fails because the next token is `end`. The problem is that
    // the `$t` after the `catch` was the tag name and there was no optional ID
    // after all. The parser sets `parseID = false` and resets to just after the
    // `catch`, and now it skips parsing the optional ID so it correctly parses
    // the `$t` as a tag name.
    bool parseID = !folded;
    auto afterCatchPos = ctx.in.getPos();
    while (true) {
      if (!folded && parseID) {
        auto id = ctx.in.takeID();
        if (id && id != label) {
          // Instead of returning an error, retry without the ID.
          parseID = false;
          ctx.in.setPos(afterCatchPos);
          continue;
        }
      }

      auto tag = tagidx(ctx);
      if (parseID && tag.getErr()) {
        // Instead of returning an error, retry without the ID.
        parseID = false;
        ctx.in.setPos(afterCatchPos);
        continue;
      }
      CHECK_ERR(tag);

      CHECK_ERR(ctx.visitCatch(catchPos, *tag));

      CHECK_ERR(instrs(ctx));

      if (folded) {
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected ')' at end of catch");
        }
      }
      break;
    }
  }

  if ((folded && ctx.in.takeSExprStart("catch_all"sv)) ||
      (!folded && ctx.in.takeKeyword("catch_all"sv))) {
    auto catchPos = ctx.in.getPos();

    if (!folded) {
      auto id = ctx.in.takeID();
      if (id && id != label) {
        return ctx.in.err("catch_all label does not match try label");
      }
    }

    CHECK_ERR(ctx.visitCatchAll(catchPos));

    CHECK_ERR(instrs(ctx));

    if (folded) {
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of catch_all");
      }
    }
  }

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try label");
    }
  }
  return ctx.visitEnd();
}